

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O0

void __thiscall
OpenMD::Morse::addExplicitInteraction
          (Morse *this,AtomType *atype1,AtomType *atype2,RealType De,RealType Re,RealType beta,
          MorseType mt)

{
  value_type vVar1;
  reference pvVar2;
  _Rb_tree_const_iterator<int> __new_size;
  reference pvVar3;
  reference pvVar4;
  undefined4 in_ECX;
  bool bVar5;
  AtomType *in_RDX;
  AtomType *in_RSI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> *in_RDI;
  RealType in_XMM0_Qa;
  RealType in_XMM1_Qa;
  RealType in_XMM2_Qa;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int mtid2;
  int mtid1;
  int atid2;
  int atid1;
  MorseInteractionData mixer;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff58;
  bool in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_88;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_78;
  value_type local_68;
  value_type local_64;
  int local_60;
  int local_5c;
  RealType local_58;
  RealType local_50;
  RealType local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  AtomType *local_18;
  
  local_58 = in_XMM0_Qa;
  local_50 = in_XMM1_Qa;
  local_48 = in_XMM2_Qa;
  local_40 = in_ECX;
  local_18 = in_RDX;
  local_5c = AtomType::getIdent(in_RSI);
  local_60 = AtomType::getIdent(local_18);
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>(in_RDI);
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
                     (value_type_conflict1 *)in_stack_ffffffffffffff58._M_node);
  local_88.first = pVar6.first._M_node;
  local_88.second = pVar6.second;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_78,&local_88);
  if ((local_78.second & 1U) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_5c);
    local_64 = *pvVar2;
  }
  else {
    local_64 = *(value_type *)&in_RDI[7].first._M_node;
    vVar1 = *(value_type *)&in_RDI[7].first._M_node;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_5c);
    *pvVar2 = vVar1;
    *(int *)&in_RDI[7].first._M_node = *(int *)&in_RDI[7].first._M_node + 1;
  }
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
                     (value_type_conflict1 *)in_stack_ffffffffffffff58._M_node);
  __new_size = pVar6.first._M_node;
  bVar5 = pVar6.second;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=
            (&local_78,(type)&stack0xffffffffffffff58);
  if ((local_78.second & 1U) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_60);
    local_68 = *pvVar2;
  }
  else {
    local_68 = *(value_type *)&in_RDI[7].first._M_node;
    vVar1 = *(value_type *)&in_RDI[7].first._M_node;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_60);
    *pvVar2 = vVar1;
    *(int *)&in_RDI[7].first._M_node = *(int *)&in_RDI[7].first._M_node + 1;
  }
  std::
  vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
            *)CONCAT71(in_stack_ffffffffffffff61,bVar5),(size_type)__new_size._M_node);
  std::
  vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                *)&in_RDI[5].second,(long)local_64);
  std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>::resize
            ((vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_> *)
             CONCAT71(in_stack_ffffffffffffff61,bVar5),(size_type)__new_size._M_node);
  pvVar3 = std::
           vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                         *)&in_RDI[5].second,(long)local_64);
  pvVar4 = std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
           ::operator[](pvVar3,(long)local_68);
  pvVar4->De = local_58;
  pvVar4->Re = local_50;
  pvVar4->beta = local_48;
  *(ulong *)&pvVar4->variant = CONCAT44(uStack_3c,local_40);
  if (local_68 != local_64) {
    std::
    vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                  *)&in_RDI[5].second,(long)local_68);
    std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>::resize
              ((vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
                *)CONCAT71(in_stack_ffffffffffffff61,bVar5),(size_type)__new_size._M_node);
    pvVar3 = std::
             vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                           *)&in_RDI[5].second,(long)local_68);
    pvVar4 = std::
             vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>::
             operator[](pvVar3,(long)local_64);
    pvVar4->De = local_58;
    pvVar4->Re = local_50;
    pvVar4->beta = local_48;
    *(ulong *)&pvVar4->variant = CONCAT44(uStack_3c,local_40);
  }
  return;
}

Assistant:

void Morse::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                     RealType De, RealType Re, RealType beta,
                                     MorseType mt) {
    MorseInteractionData mixer;
    mixer.De      = De;
    mixer.Re      = Re;
    mixer.beta    = beta;
    mixer.variant = mt;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int mtid1, mtid2;

    pair<set<int>::iterator, bool> ret;
    ret = Mtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the Mtypes list, just get the mtid:
      mtid1 = Mtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      mtid1        = nM_;
      Mtids[atid1] = nM_;
      nM_++;
    }
    ret = Mtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the Mtypes list, just get the mtid:
      mtid2 = Mtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      mtid2        = nM_;
      Mtids[atid2] = nM_;
      nM_++;
    }

    MixingMap.resize(nM_);
    MixingMap[mtid1].resize(nM_);
    MixingMap[mtid1][mtid2] = mixer;
    if (mtid2 != mtid1) {
      MixingMap[mtid2].resize(nM_);
      MixingMap[mtid2][mtid1] = mixer;
    }
  }